

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLElement * __thiscall tinyxml2::XMLNode::PreviousSiblingElement(XMLNode *this,char *name)

{
  XMLElement *pXVar1;
  XMLElement *element;
  XMLNode *node;
  char *name_local;
  XMLNode *this_local;
  
  element = (XMLElement *)this->_prev;
  while( true ) {
    if (element == (XMLElement *)0x0) {
      return (XMLElement *)0x0;
    }
    pXVar1 = ToElementWithName(&element->super_XMLNode,name);
    if (pXVar1 != (XMLElement *)0x0) break;
    element = (XMLElement *)(element->super_XMLNode)._prev;
  }
  return pXVar1;
}

Assistant:

const XMLElement* XMLNode::PreviousSiblingElement( const char* name ) const
{
    for( const XMLNode* node = _prev; node; node = node->_prev ) {
        const XMLElement* element = node->ToElementWithName( name );
        if ( element ) {
            return element;
        }
    }
    return 0;
}